

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

void __thiscall
Js::DynamicProfileInfo::RecordCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,
          FunctionInfo *calleeFunctionInfo,JavascriptFunction *calleeFunction,uint actualArgCount,
          bool isConstructorCall,InlineCacheIndex ldFldInlineCacheId)

{
  ushort uVar1;
  SourceId oldSourceId;
  LocalFunctionId oldFunctionId;
  CallSiteInfo *pCVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  FunctionBody *this_00;
  SourceId local_44;
  FunctionBody *pFStack_40;
  SourceId sourceId;
  LocalFunctionId local_34 [2];
  LocalFunctionId functionId;
  
  pFStack_40 = functionBody;
  CCLock::Enter((CCLock *)&callSiteInfoCS);
  if ((this->persistsAcrossScriptContexts == false) && ((this->functionBody).ptr != pFStack_40)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x2c2,
                                "(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody)"
                                ,
                                "!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody"
                               );
    if (!bVar4) goto LAB_009607ce;
    *puVar5 = 0;
  }
  if (((calleeFunctionInfo != (FunctionInfo *)0x0) && (callSiteId < 0x20)) &&
     ((FunctionBody *)(calleeFunctionInfo->functionBodyImpl).ptr == pFStack_40)) {
    this->m_recursiveInlineInfo = this->m_recursiveInlineInfo | 1 << ((byte)callSiteId & 0x1f);
  }
  pCVar2 = (this->callSiteInfo).ptr;
  uVar1 = *(ushort *)&pCVar2[callSiteId].field_0x2;
  if ((short)uVar1 < 0) {
    if (0xf < actualArgCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x2fb,"(doInline)","doInline");
      if (!bVar4) goto LAB_009607ce;
      *puVar5 = 0;
      uVar1 = *(ushort *)&(this->callSiteInfo).ptr[callSiteId].field_0x2;
    }
    if (((uVar1 >> 0xd & 1) == 0) == isConstructorCall) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x2fc,
                                  "(callSiteInfo[callSiteId].isConstructorCall == isConstructorCall)"
                                  ,"callSiteInfo[callSiteId].isConstructorCall == isConstructorCall"
                                 );
      if (!bVar4) {
LAB_009607ce:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    RecordPolymorphicCallSiteInfo(this,pFStack_40,callSiteId,calleeFunctionInfo);
    goto LAB_009607b3;
  }
  oldSourceId = pCVar2[callSiteId].u.functionData.sourceId;
  if (oldSourceId == 0xfffffffc) goto LAB_009607b3;
  oldFunctionId = pCVar2[callSiteId].u.functionData.functionId;
  this_00 = pFStack_40;
  GetSourceAndFunctionId(pFStack_40,calleeFunctionInfo,calleeFunction,&local_44,local_34);
  if (oldSourceId == 0xffffffff) {
    (this->callSiteInfo).ptr[callSiteId].u.functionData.sourceId = local_44;
    (this->callSiteInfo).ptr[callSiteId].u.functionData.functionId = local_34[0];
    this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
  }
  else if (oldFunctionId != local_34[0] || oldSourceId != local_44) {
    if (oldFunctionId != 0xffffffff) {
      this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
    }
    if (actualArgCount < 0x10) {
      bVar4 = IsPolymorphicCallSite
                        ((DynamicProfileInfo *)this_00,local_34[0],local_44,oldFunctionId,
                         oldSourceId);
      if (bVar4) {
        CreatePolymorphicDynamicProfileCallSiteInfo
                  (this,pFStack_40,callSiteId,local_34[0],oldFunctionId,local_44,oldSourceId);
        goto LAB_00960760;
      }
    }
    (this->callSiteInfo).ptr[callSiteId].u.functionData.functionId = 0xffffffff;
  }
LAB_00960760:
  pCVar2 = (this->callSiteInfo).ptr;
  *(ushort *)&pCVar2[callSiteId].field_0x2 =
       *(ushort *)&pCVar2[callSiteId].field_0x2 & 0xdfff | (ushort)isConstructorCall << 0xd;
  pCVar2 = (this->callSiteInfo).ptr;
  *(ushort *)&pCVar2[callSiteId].field_0x2 =
       *(ushort *)&pCVar2[callSiteId].field_0x2 & 0xbfff | (ushort)(0xf < actualArgCount) << 0xe;
  (this->callSiteInfo).ptr[callSiteId].ldFldInlineCacheId = ldFldInlineCacheId;
LAB_009607b3:
  CCLock::Leave((CCLock *)&callSiteInfoCS);
  return;
}

Assistant:

void DynamicProfileInfo::RecordCallSiteInfo(FunctionBody* functionBody, ProfileId callSiteId, FunctionInfo* calleeFunctionInfo, JavascriptFunction* calleeFunction, uint actualArgCount, bool isConstructorCall, InlineCacheIndex ldFldInlineCacheId)
    {
        AutoCriticalSection cs(&this->callSiteInfoCS);

#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        // If we persistsAcrossScriptContext, the dynamic profile info may be referred to by multiple function body from
        // different script context
        Assert(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody);
#endif
        bool doInline = true;
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo
        if (actualArgCount > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            doInline = false;
        }

        // Mark the callsite bit where caller and callee is same function
        if (calleeFunctionInfo && functionBody == calleeFunctionInfo->GetFunctionProxy() && callSiteId < 32)
        {
            this->m_recursiveInlineInfo = this->m_recursiveInlineInfo | (1 << callSiteId);
        }

        if (!callSiteInfo[callSiteId].isPolymorphic)
        {
            Js::SourceId oldSourceId = callSiteInfo[callSiteId].u.functionData.sourceId;
            if (oldSourceId == InvalidSourceId)
            {
                return;
            }

            Js::LocalFunctionId oldFunctionId = callSiteInfo[callSiteId].u.functionData.functionId;

            Js::SourceId sourceId;
            Js::LocalFunctionId functionId;
            GetSourceAndFunctionId(functionBody, calleeFunctionInfo, calleeFunction, &sourceId, &functionId);

            if (oldSourceId == NoSourceId)
            {
                callSiteInfo[callSiteId].u.functionData.sourceId = sourceId;
                callSiteInfo[callSiteId].u.functionData.functionId = functionId;
                this->currentInlinerVersion++; // we don't mind if this overflows
            }
            else if (oldSourceId != sourceId || oldFunctionId != functionId)
            {
                if (oldFunctionId != CallSiteMixed)
                {
                    this->currentInlinerVersion++; // we don't mind if this overflows
                }

                if (doInline && IsPolymorphicCallSite(functionId, sourceId, oldFunctionId, oldSourceId))
                {
                    CreatePolymorphicDynamicProfileCallSiteInfo(functionBody, callSiteId, functionId, oldFunctionId, sourceId, oldSourceId);
                }
                else
                {
                    callSiteInfo[callSiteId].u.functionData.functionId = CallSiteMixed;
                }
            }
            callSiteInfo[callSiteId].isConstructorCall = isConstructorCall;
            callSiteInfo[callSiteId].dontInline = !doInline;
            callSiteInfo[callSiteId].ldFldInlineCacheId = ldFldInlineCacheId;
        }
        else
        {
            Assert(doInline);
            Assert(callSiteInfo[callSiteId].isConstructorCall == isConstructorCall);
            RecordPolymorphicCallSiteInfo(functionBody, callSiteId, calleeFunctionInfo);
        }

        return;
    }